

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O1

void __thiscall
crypto_tests::CryptoTest::
TestVector<CSHA512,std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (CryptoTest *this,CSHA512 *h,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *out)

{
  pointer puVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  CSHA512 *pCVar6;
  uint64_t len;
  uint64_t maxval;
  ulong uVar7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  iterator pvVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  bool bVar11;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hash;
  CSHA512 hasher;
  check_type cVar12;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  assertion_result local_280;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1e8;
  CSHA512 local_1c8;
  undefined1 local_100 [16];
  undefined1 *local_f0;
  char **local_e8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x25;
  file.m_begin = (iterator)&local_1f8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_208,msg);
  local_1c8.s[0] =
       CONCAT71(local_1c8.s[0]._1_7_,
                (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start == 0x40);
  local_1c8.s[1] = 0;
  local_1c8.s[2] = 0;
  local_280._0_8_ = "out.size() == h.OUTPUT_SIZE";
  local_280.m_message.px = (element_type *)0xe7e231;
  local_100[8] = false;
  local_100._0_8_ = &PTR__lazy_ostream_013abc70;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_210 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_e8 = (char **)&local_280;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1c8,(lazy_ostream *)local_100,1,0,WARN,_cVar12,
             (size_t)&local_218,0x25);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1c8.s + 2));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&local_1e8,
             (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start);
  memcpy((CSHA512 *)local_100,h,200);
  pCVar6 = CSHA512::Write((CSHA512 *)local_100,(uchar *)(in->_M_dataplus)._M_p,in->_M_string_length)
  ;
  CSHA512::Finalize(pCVar6,local_1e8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x2a;
  file_00.m_begin = (iterator)&local_228;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_238,
             msg_00);
  puVar1 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar1) {
    if (local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      bVar11 = true;
    }
    else {
      iVar3 = bcmp(local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,puVar1,
                   (long)local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      bVar11 = iVar3 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  local_1c8.s[0] = CONCAT71(local_1c8.s[0]._1_7_,bVar11);
  local_1c8.s[1] = 0;
  local_1c8.s[2] = 0;
  local_280._0_8_ = "hash == out";
  local_280.m_message.px = (element_type *)0xf92d81;
  local_100[8] = false;
  local_100._0_8_ = &PTR__lazy_ostream_013abc70;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_240 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_e8 = (char **)&local_280;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1c8,(lazy_ostream *)local_100,1,0,WARN,_cVar12,
             (size_t)&local_248,0x2a);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1c8.s + 2));
  iVar3 = 0;
  do {
    memcpy(local_100,h,200);
    uVar7 = in->_M_string_length;
    if (uVar7 != 0) {
      uVar10 = 0;
      do {
        uVar7 = (uVar7 - uVar10) + 1 >> 1;
        if (uVar7 == 0) {
          uVar4 = 0x40;
        }
        else {
          lVar2 = 0x3f;
          if (uVar7 != 0) {
            for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          uVar4 = (uint)lVar2 ^ 0x3f;
        }
        do {
          len = RandomMixin<FastRandomContext>::randbits
                          (&(this->super_BasicTestingSetup).m_rng.
                            super_RandomMixin<FastRandomContext>,0x40 - uVar4);
        } while (uVar7 < len);
        CSHA512::Write((CSHA512 *)local_100,(uchar *)((in->_M_dataplus)._M_p + uVar10),len);
        uVar10 = len + uVar10;
        if (uVar10 != 0) {
          uVar7 = in->_M_string_length;
          if ((uVar10 <= uVar7 && uVar7 - uVar10 != 0) &&
             (uVar7 < uVar10 + ((long)(out->
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(out->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_start) * 2)) {
            memcpy(&local_1c8,local_100,200);
            pCVar6 = CSHA512::Write(&local_1c8,(uchar *)((in->_M_dataplus)._M_p + uVar10),
                                    uVar7 - uVar10);
            CSHA512::Finalize(pCVar6,local_1e8.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
            local_258 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
            ;
            local_250 = "";
            local_268 = &boost::unit_test::basic_cstring<char_const>::null;
            local_260 = &boost::unit_test::basic_cstring<char_const>::null;
            file_01.m_end = (iterator)0x37;
            file_01.m_begin = (iterator)&local_258;
            msg_01.m_end = pvVar9;
            msg_01.m_begin = pvVar8;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                       (size_t)&local_268,msg_01);
            puVar1 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if ((long)local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start ==
                (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) {
              if (local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
                bVar11 = true;
              }
              else {
                iVar5 = bcmp(local_1e8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,puVar1,
                             (long)local_1e8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_1e8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
                bVar11 = iVar5 == 0;
              }
            }
            else {
              bVar11 = false;
            }
            local_280.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
            value = (readonly_property<bool>)(readonly_property<bool>)bVar11;
            local_280.m_message.px = (element_type *)0x0;
            local_280.m_message.pn.pi_ = (sp_counted_base *)0x0;
            local_290 = "hash == out";
            local_288 = "";
            local_1c8.s[1] = local_1c8.s[1] & 0xffffffffffffff00;
            local_1c8.s[0] = (uint64_t)&PTR__lazy_ostream_013abc70;
            local_1c8.s[2] = (uint64_t)boost::unit_test::lazy_ostream::inst;
            local_1c8.s[3] = (uint64_t)&local_290;
            local_2a0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
            ;
            local_298 = "";
            pvVar8 = (iterator)0x1;
            pvVar9 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (&local_280,(lazy_ostream *)&local_1c8,1,0,WARN,_cVar12,(size_t)&local_2a0,
                       0x37);
            boost::detail::shared_count::~shared_count(&local_280.m_message.pn);
          }
        }
        uVar7 = in->_M_string_length;
      } while (uVar10 < uVar7);
    }
    CSHA512::Finalize((CSHA512 *)local_100,
                      local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    local_2b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_2a8 = "";
    local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x3b;
    file_02.m_begin = (iterator)&local_2b0;
    msg_02.m_end = pvVar9;
    msg_02.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2c0,
               msg_02);
    puVar1 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start ==
        (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar1) {
      if (local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        bVar11 = true;
      }
      else {
        iVar5 = bcmp(local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,puVar1,
                     (long)local_1e8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_1e8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
        bVar11 = iVar5 == 0;
      }
    }
    else {
      bVar11 = false;
    }
    local_280.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar11;
    local_280.m_message.px = (element_type *)0x0;
    local_280.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_290 = "hash == out";
    local_288 = "";
    local_1c8.s[1] = local_1c8.s[1] & 0xffffffffffffff00;
    local_1c8.s[0] = (uint64_t)&PTR__lazy_ostream_013abc70;
    local_1c8.s[2] = (uint64_t)boost::unit_test::lazy_ostream::inst;
    local_1c8.s[3] = (uint64_t)&local_290;
    local_2d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_2c8 = "";
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_280,(lazy_ostream *)&local_1c8,1,0,WARN,_cVar12,(size_t)&local_2d0,0x3b);
    boost::detail::shared_count::~shared_count(&local_280.m_message.pn);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0x20);
  if (local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TestVector(const Hasher &h, const In &in, const Out &out) {
    Out hash;
    BOOST_CHECK(out.size() == h.OUTPUT_SIZE);
    hash.resize(out.size());
    {
        // Test that writing the whole input string at once works.
        Hasher(h).Write((const uint8_t*)in.data(), in.size()).Finalize(hash.data());
        BOOST_CHECK(hash == out);
    }
    for (int i=0; i<32; i++) {
        // Test that writing the string broken up in random pieces works.
        Hasher hasher(h);
        size_t pos = 0;
        while (pos < in.size()) {
            size_t len = m_rng.randrange((in.size() - pos + 1) / 2 + 1);
            hasher.Write((const uint8_t*)in.data() + pos, len);
            pos += len;
            if (pos > 0 && pos + 2 * out.size() > in.size() && pos < in.size()) {
                // Test that writing the rest at once to a copy of a hasher works.
                Hasher(hasher).Write((const uint8_t*)in.data() + pos, in.size() - pos).Finalize(hash.data());
                BOOST_CHECK(hash == out);
            }
        }
        hasher.Finalize(hash.data());
        BOOST_CHECK(hash == out);
    }
}